

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

UBool __thiscall icu_63::MessagePattern::Part::operator==(Part *this,Part *other)

{
  if (this == other) {
    return '\x01';
  }
  if ((((this->type == other->type) && (this->index == other->index)) &&
      (this->length == other->length)) && (this->value == other->value)) {
    return this->limitPartIndex == other->limitPartIndex;
  }
  return '\0';
}

Assistant:

UBool
MessagePattern::Part::operator==(const Part &other) const {
    if(this==&other) {
        return TRUE;
    }
    return
        type==other.type &&
        index==other.index &&
        length==other.length &&
        value==other.value &&
        limitPartIndex==other.limitPartIndex;
}